

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,AssignmentStatement *ptr)

{
  allocator<char> local_39;
  string local_38;
  AssignmentStatement *local_18;
  AssignmentStatement *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (AssignmentStatement *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"assignment stmt",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  arrow(this,local_18,local_18->assignment);
  (**(local_18->assignment->super_Base)._vptr_Base)(local_18->assignment,this);
  return;
}

Assistant:

void gv_visitor::visit(AssignmentStatement* ptr) {
    box(ptr, "assignment stmt");
    arrow(ptr, ptr->assignment);
    ptr->assignment->accept(this);
}